

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

void Server::process_request_line(single_connection *conn)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  undefined8 uVar6;
  int local_16c;
  int i;
  char *local_158;
  char *find_and;
  char *key_search_begin;
  string temp_key_str;
  char temp_key [256];
  int key_len;
  int len;
  char *ptr;
  single_connection *conn_local;
  
  printf("------ REQUEST LINE PARSING START ------ \n");
  conn->state = 4;
  find_and = strpbrk(conn->querybuf + conn->query_start_index," ");
  if (find_and == (char *)0x0) {
    printf("[ERROR] Request method parsing failed \n");
  }
  else {
    iVar3 = ((int)find_and - (int)conn->querybuf) - conn->query_start_index;
    strncpy(conn->method,conn->querybuf + conn->query_start_index,(long)iVar3);
    printf("[Info] Request method: %s \n",conn->method);
    conn->query_start_index = iVar3 + 1 + conn->query_start_index;
    iVar3 = strcmp(conn->method,"GET");
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&key_search_begin);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&query_list_abi_cxx11_);
      pcVar4 = strpbrk(conn->querybuf + conn->query_start_index," ");
      if (pcVar4 == (char *)0x0) {
        printf("[ERROR] Request uri parsing failed\n");
        bVar2 = true;
      }
      else {
        pcVar1 = conn->querybuf;
        iVar3 = conn->query_start_index;
        while ((find_and = strpbrk(find_and + 1,"="), find_and != (char *)0x0 &&
               (0 < (long)pcVar4 - (long)find_and))) {
          local_158 = strpbrk(find_and,"&");
          if ((local_158 == (char *)0x0) || (pcVar4 == local_158)) {
            local_158 = pcVar4;
          }
          temp_key_str.field_2._8_8_ = 0;
          strncpy(temp_key_str.field_2._M_local_buf + 8,find_and + 1,
                  (long)(int)(~(uint)find_and + (int)local_158));
          std::__cxx11::string::operator=
                    ((string *)&key_search_begin,temp_key_str.field_2._M_local_buf + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&query_list_abi_cxx11_,(value_type *)&key_search_begin);
        }
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&query_list_abi_cxx11_);
        printf("[INFO] Get %d key(s) from client \n",sVar5);
        for (local_16c = 0;
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&query_list_abi_cxx11_), (ulong)(long)local_16c < sVar5;
            local_16c = local_16c + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&query_list_abi_cxx11_,(long)local_16c);
          uVar6 = std::__cxx11::string::c_str();
          printf("[INFO] The key %d is %s \n",(ulong)(local_16c + 1),uVar6);
        }
        conn->query_start_index =
             (((int)pcVar4 - (int)pcVar1) - iVar3) + 1 + conn->query_start_index;
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&key_search_begin);
      if (bVar2) {
        return;
      }
    }
    else {
      pcVar4 = strpbrk(conn->querybuf + conn->query_start_index," ");
      if (pcVar4 == (char *)0x0) {
        printf("[ERROR] Request uri parsing failed \n");
        return;
      }
      iVar3 = ((int)pcVar4 - (int)conn->querybuf) - conn->query_start_index;
      strncpy(conn->uri,conn->querybuf + conn->query_start_index,(long)iVar3);
      printf("[INFO] Request uri: %s \n",conn->uri);
      conn->query_start_index = iVar3 + 1 + conn->query_start_index;
    }
    pcVar4 = strpbrk(conn->querybuf,"\n");
    if (pcVar4 == (char *)0x0) {
      printf("[ERROR] Request version parsing failed \n");
    }
    else {
      iVar3 = ((int)pcVar4 - (int)conn->querybuf) - conn->query_start_index;
      strncpy(conn->version,conn->querybuf + conn->query_start_index,(long)(iVar3 + -1));
      printf("[INFO] Request version: %s \n",conn->version);
      conn->query_start_index = iVar3 + 1 + conn->query_start_index;
      printf("------ REQUEST LINE PARSING END ------ \n");
      process_head(conn);
    }
  }
  return;
}

Assistant:

void Server::process_request_line(single_connection *conn)
{
    printf("------ REQUEST LINE PARSING START ------ \n");
    /* 连接状态为处理请求行 */
    conn->state = QUERY_LINE;

    /* 检验第一个空格的位置，用以定位请求方法 */
    char *ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
    if (!ptr)
    {
        printf("[ERROR] Request method parsing failed \n");
        return;
    }
    /* 请求方法长度 */
    int len = ptr - conn->querybuf - conn->query_start_index;
    /* 将请求方法复制到连接结构体中的method元素中 */
    strncpy(conn->method, conn->querybuf + conn->query_start_index, len);
    printf("[Info] Request method: %s \n", conn->method);
    /* 重新定位指针偏移量 */
    conn->query_start_index += (len + 1);

    /* 根据请求方法进行相应操作，当为GET时，将请求uri中的用户查询键分离出来后加入query_list中 */
    if (strcmp(conn->method, "GET") == 0)
    {
        /* key_len为各查询键的长度 */
        int key_len;
        /* 用户查询键临时变量 */
        char temp_key[256];
        /* 临时变量str类型 */
        string temp_key_str;
        /* 设置指针保存uri初始位置指针 */
        char *key_search_begin = NULL;
        /* findand为查询到的“&”的位置 */
        char *find_and = NULL;
        /* 清空query_list数组 */
        query_list.clear();
        /* 将uri初始位置指针赋值给key_search_begin */
        key_search_begin = ptr;
        /* 检验第二个空格的位置，用以定位请求uri */
        ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
        if (!ptr)
        {
            printf("[ERROR] Request uri parsing failed\n");
            return;
        }
        /* 目标资源uri长度 */
        len = ptr - conn->querybuf - conn->query_start_index;
        /* 将用户输入的查询串提取出键，放入query_list数组中 */
        while (true)
        {
            /* 定位“=”的位置 */
            key_search_begin = strpbrk(key_search_begin + 1, "=");
            /* 若该次查询到的等于号为空或其在ptr指针后，则退出循环 */
            if ((key_search_begin == NULL) || (ptr - key_search_begin <= 0))
            {
                /* 输出获得用户查询串中键的数量 */
                printf("[INFO] Get %d key(s) from client \n", query_list.size());
                break;
            }
            else
            {
                /* 定位“&”的位置 */
                find_and = strpbrk(key_search_begin, "&");
                /* 若该次查询到的“&”为空或其在ptr指针之后，则将其设为ptr */
                if ((find_and == NULL) || (ptr - find_and == 0))
                {
                    find_and = ptr;
                }
                /* 键长 */
                key_len = find_and - key_search_begin - 1;
                /* 拷贝键到temp_key */
                memset(temp_key, '\0', sizeof(temp_key));
                strncpy(temp_key, key_search_begin + 1, key_len);
                temp_key_str = temp_key;
                /* 向query_list添加键 */
                query_list.push_back(temp_key_str);
            }
        }
        /* 输出用户查询串中键的具体信息 */
        for (int i = 0; i < query_list.size(); i++)
        {
            printf("[INFO] The key %d is %s \n", i + 1, query_list[i].c_str());
        }
        conn->query_start_index += (len + 1);
    }
    /* 请求方法为非GET，此处为POST */
    else
    {
        ptr = strpbrk(conn->querybuf + conn->query_start_index, " ");
        if (!ptr)
        {
            printf("[ERROR] Request uri parsing failed \n");
            return;
        }
        /* 目标资源uri长度 */
        len = ptr - conn->querybuf - conn->query_start_index;
        strncpy(conn->uri, conn->querybuf + conn->query_start_index, len);

        printf("[INFO] Request uri: %s \n", conn->uri);

        conn->query_start_index += (len + 1);
    }

    /* 检验\n字符的位置，该行末尾为\r\n */
    ptr = strpbrk(conn->querybuf, "\n");
    if (!ptr)
    {
        printf("[ERROR] Request version parsing failed \n");
        return;
    }
    /* 客户端wget程序使用的HTTP版本号 */
    len = ptr - conn->querybuf - conn->query_start_index;
    /* 最后一个参数需要在原长度-1，即除去\r */
    strncpy(conn->version, conn->querybuf + conn->query_start_index, len - 1);

    printf("[INFO] Request version: %s \n", conn->version);

    conn->query_start_index += (len + 1);

    printf("------ REQUEST LINE PARSING END ------ \n");

    /* 解析请求头部 */
    process_head(conn);
}